

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dofhandler.cc
# Opt level: O3

void __thiscall lf::assemble::UniformFEDofHandler::initIndexArrays(UniformFEDofHandler *this)

{
  pointer *pppEVar1;
  undefined8 *puVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  element_type *peVar5;
  iterator iVar6;
  pointer plVar7;
  pointer plVar8;
  bool bVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  size_type sVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 *puVar14;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  size_type *psVar15;
  long extraout_RDX;
  long extraout_RDX_00;
  int iVar16;
  size_type sVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  uint uVar22;
  long lVar23;
  vector<lf::mesh::Entity_const*,std::allocator<lf::mesh::Entity_const*>> *pvVar24;
  long lVar25;
  Entity *node_p;
  stringstream ss;
  Entity *local_278;
  string local_270;
  string local_250;
  string local_230;
  ulong local_210;
  vector<lf::mesh::Entity_const*,std::allocator<lf::mesh::Entity_const*>> *local_208;
  vector<lf::mesh::Entity_const*,std::allocator<lf::mesh::Entity_const*>> *local_200;
  uint local_1f8;
  int local_1f4;
  size_type *local_1f0;
  size_type *local_1e8;
  ulong local_1e0;
  long local_1d8;
  ulong local_1d0;
  vector<lf::mesh::Entity_const*,std::allocator<lf::mesh::Entity_const*>> *local_1c8;
  ulong local_1c0;
  RefEl local_1b8 [16];
  ostream local_1a8 [376];
  undefined4 extraout_var_01;
  
  peVar5 = (this->mesh_).super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  iVar10 = (*peVar5->_vptr_Mesh[3])(peVar5,2);
  std::vector<long,_std::allocator<long>_>::resize
            ((this->dofs_)._M_elems + this->kNodeOrd,
             (ulong)((this->num_dofs_)._M_elems[this->kNodeOrd] * iVar10));
  uVar18 = 0;
  local_210 = CONCAT44(local_210._4_4_,iVar10);
  if (iVar10 == 0) {
    lVar25 = 0;
  }
  else {
    local_208 = (vector<lf::mesh::Entity_const*,std::allocator<lf::mesh::Entity_const*>> *)
                &this->dof_entities_;
    lVar25 = 0;
    do {
      peVar5 = (this->mesh_).super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      iVar16 = (int)uVar18;
      iVar10 = (*peVar5->_vptr_Mesh[6])(peVar5,2,uVar18);
      local_278 = (Entity *)CONCAT44(extraout_var,iVar10);
      peVar5 = (this->mesh_).super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      iVar10 = (*peVar5->_vptr_Mesh[5])(peVar5,local_278);
      if (iVar10 != iVar16) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Node index mismatch",0x13);
        paVar3 = &local_250.field_2;
        local_250._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_250,"mesh_->Index(*node_p) == node_idx","");
        paVar4 = &local_270.field_2;
        local_270._M_dataplus._M_p = (pointer)paVar4;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_270,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/dofhandler.cc"
                   ,"");
        std::__cxx11::stringbuf::str();
        base::AssertionFailed(&local_250,&local_270,0x9b,&local_230);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != paVar4) {
          operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != paVar3) {
          operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
        }
        local_250._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"false","");
        local_270._M_dataplus._M_p = (pointer)paVar4;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_270,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/dofhandler.cc"
                   ,"");
        local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"");
        base::AssertionFailed(&local_250,&local_270,0x9b,&local_230);
        goto LAB_0014d92d;
      }
      uVar22 = this->num_loc_dof_point_;
      if (uVar22 != 0) {
        uVar11 = (this->num_dofs_)._M_elems[this->kNodeOrd];
        lVar23 = 0;
        do {
          (this->dofs_)._M_elems[this->kNodeOrd].super__Vector_base<long,_std::allocator<long>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar11 * iVar16 + (int)lVar23] = lVar25 + lVar23;
          iVar6._M_current =
               (this->dof_entities_).
               super__Vector_base<const_lf::mesh::Entity_*,_std::allocator<const_lf::mesh::Entity_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar6._M_current ==
              (this->dof_entities_).
              super__Vector_base<const_lf::mesh::Entity_*,_std::allocator<const_lf::mesh::Entity_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<lf::mesh::Entity_const*,std::allocator<lf::mesh::Entity_const*>>::
            _M_realloc_insert<lf::mesh::Entity_const*const&>(local_208,iVar6,&local_278);
            uVar22 = this->num_loc_dof_point_;
          }
          else {
            *iVar6._M_current = local_278;
            pppEVar1 = &(this->dof_entities_).
                        super__Vector_base<const_lf::mesh::Entity_*,_std::allocator<const_lf::mesh::Entity_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            *pppEVar1 = *pppEVar1 + 1;
          }
          lVar23 = lVar23 + 1;
        } while ((uint)lVar23 < uVar22);
        lVar25 = lVar25 + lVar23;
      }
      uVar18 = (ulong)(iVar16 + 1U);
    } while (iVar16 + 1U != (uint)local_210);
  }
  peVar5 = (this->mesh_).super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  iVar10 = (*peVar5->_vptr_Mesh[3])(peVar5,1);
  std::vector<long,_std::allocator<long>_>::resize
            ((this->dofs_)._M_elems + this->kEdgeOrd,
             (ulong)((this->num_dofs_)._M_elems[this->kEdgeOrd] * iVar10));
  local_210 = CONCAT44(local_210._4_4_,iVar10);
  if (iVar10 != 0) {
    local_200 = (vector<lf::mesh::Entity_const*,std::allocator<lf::mesh::Entity_const*>> *)
                &this->dof_entities_;
    pvVar24 = (vector<lf::mesh::Entity_const*,std::allocator<lf::mesh::Entity_const*>> *)0x0;
    do {
      peVar5 = (this->mesh_).super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      iVar10 = (*peVar5->_vptr_Mesh[6])(peVar5,1,pvVar24);
      local_278 = (Entity *)CONCAT44(extraout_var_00,iVar10);
      peVar5 = (this->mesh_).super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      iVar10 = (*peVar5->_vptr_Mesh[5])(peVar5,local_278);
      if (iVar10 != (int)pvVar24) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Edge index mismatch",0x13);
        paVar3 = &local_250.field_2;
        local_250._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_250,"mesh_->Index(*edge_p) == edge_idx","");
        paVar4 = &local_270.field_2;
        local_270._M_dataplus._M_p = (pointer)paVar4;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_270,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/dofhandler.cc"
                   ,"");
        std::__cxx11::stringbuf::str();
        base::AssertionFailed(&local_250,&local_270,0xb2,&local_230);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != paVar4) {
          operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != paVar3) {
          operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
        }
        local_250._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"false","");
        local_270._M_dataplus._M_p = (pointer)paVar4;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_270,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/dofhandler.cc"
                   ,"");
        local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"");
        base::AssertionFailed(&local_250,&local_270,0xb2,&local_230);
        goto LAB_0014d92d;
      }
      uVar22 = (this->num_dofs_)._M_elems[this->kEdgeOrd] * (int)pvVar24;
      uVar18 = (ulong)uVar22;
      local_208 = pvVar24;
      iVar10 = (*local_278->_vptr_Entity[1])(local_278,1);
      puVar14 = (undefined8 *)CONCAT44(extraout_var_01,iVar10);
      if (extraout_RDX != 0) {
        puVar2 = puVar14 + extraout_RDX;
        do {
          peVar5 = (this->mesh_).
                   super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          iVar10 = (*peVar5->_vptr_Mesh[5])(peVar5,*puVar14);
          uVar22 = (this->num_dofs_)._M_elems[this->kNodeOrd];
          if (uVar22 != 0) {
            uVar11 = iVar10 * uVar22;
            plVar7 = (this->dofs_)._M_elems[this->kNodeOrd].
                     super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
                     ._M_start;
            plVar8 = (this->dofs_)._M_elems[this->kEdgeOrd].
                     super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
                     ._M_start;
            uVar19 = uVar18;
            do {
              uVar21 = (ulong)uVar11;
              uVar11 = uVar11 + 1;
              uVar18 = (ulong)((int)uVar19 + 1);
              plVar8[uVar19] = plVar7[uVar21];
              uVar22 = uVar22 - 1;
              uVar19 = uVar18;
            } while (uVar22 != 0);
          }
          uVar22 = (uint)uVar18;
          puVar14 = puVar14 + 1;
        } while (puVar14 != puVar2);
      }
      pvVar24 = local_200;
      uVar11 = this->num_loc_dof_segment_;
      if (uVar11 != 0) {
        lVar23 = 0;
        do {
          (this->dofs_)._M_elems[this->kEdgeOrd].super__Vector_base<long,_std::allocator<long>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar22 + (int)lVar23] = lVar25 + lVar23;
          iVar6._M_current =
               (this->dof_entities_).
               super__Vector_base<const_lf::mesh::Entity_*,_std::allocator<const_lf::mesh::Entity_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar6._M_current ==
              (this->dof_entities_).
              super__Vector_base<const_lf::mesh::Entity_*,_std::allocator<const_lf::mesh::Entity_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<lf::mesh::Entity_const*,std::allocator<lf::mesh::Entity_const*>>::
            _M_realloc_insert<lf::mesh::Entity_const*const&>(pvVar24,iVar6,&local_278);
            uVar11 = this->num_loc_dof_segment_;
          }
          else {
            *iVar6._M_current = local_278;
            pppEVar1 = &(this->dof_entities_).
                        super__Vector_base<const_lf::mesh::Entity_*,_std::allocator<const_lf::mesh::Entity_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            *pppEVar1 = *pppEVar1 + 1;
          }
          lVar23 = lVar23 + 1;
        } while ((uint)lVar23 < uVar11);
        lVar25 = lVar25 + lVar23;
      }
      uVar22 = (int)local_208 + 1;
      pvVar24 = (vector<lf::mesh::Entity_const*,std::allocator<lf::mesh::Entity_const*>> *)
                (ulong)uVar22;
    } while (uVar22 != (uint)local_210);
  }
  peVar5 = (this->mesh_).super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  uVar18 = 0;
  uVar22 = (*peVar5->_vptr_Mesh[3])(peVar5,0);
  std::vector<long,_std::allocator<long>_>::resize
            ((this->dofs_)._M_elems + this->kCellOrd,
             (ulong)((this->num_dofs_)._M_elems[this->kCellOrd] * uVar22));
  if (uVar22 != 0) {
    uVar11 = this->num_loc_dof_segment_;
    local_210 = (ulong)uVar11;
    uVar12 = (this->num_dofs_)._M_elems[this->kEdgeOrd];
    local_1d0 = (ulong)(uVar11 - 1);
    local_1f0 = &this->num_loc_dof_quad_;
    local_1e8 = &this->num_loc_dof_tria_;
    local_1c8 = (vector<lf::mesh::Entity_const*,std::allocator<lf::mesh::Entity_const*>> *)
                &this->dof_entities_;
    local_1d8 = local_1d0 + 1;
    local_1f4 = uVar12 - 1;
    local_1c0 = (ulong)(uVar12 - uVar11);
    local_1f8 = uVar22;
    do {
      peVar5 = (this->mesh_).super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      iVar10 = (*peVar5->_vptr_Mesh[6])(peVar5,0,uVar18);
      local_278 = (Entity *)CONCAT44(extraout_var_02,iVar10);
      peVar5 = (this->mesh_).super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      iVar10 = (*peVar5->_vptr_Mesh[5])(peVar5,local_278);
      if ((int)uVar18 != iVar10) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"cell index mismatch",0x13);
        paVar3 = &local_250.field_2;
        local_250._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_250,"cell_idx == mesh_->Index(*cell_p)","");
        paVar4 = &local_270.field_2;
        local_270._M_dataplus._M_p = (pointer)paVar4;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_270,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/dofhandler.cc"
                   ,"");
        std::__cxx11::stringbuf::str();
        base::AssertionFailed(&local_250,&local_270,0xd8,&local_230);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != paVar4) {
          operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != paVar3) {
          operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
        }
        local_250._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"false","");
        local_270._M_dataplus._M_p = (pointer)paVar4;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_270,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/dofhandler.cc"
                   ,"");
        local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"");
        base::AssertionFailed(&local_250,&local_270,0xd8,&local_230);
        goto LAB_0014d92d;
      }
      uVar22 = (this->num_dofs_)._M_elems[this->kCellOrd] * (int)uVar18;
      local_1e0 = uVar18;
      iVar10 = (*local_278->_vptr_Entity[1])(local_278,2);
      puVar14 = (undefined8 *)CONCAT44(extraout_var_03,iVar10);
      if (extraout_RDX_00 != 0) {
        puVar2 = puVar14 + extraout_RDX_00;
        do {
          peVar5 = (this->mesh_).
                   super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          iVar10 = (*peVar5->_vptr_Mesh[5])(peVar5,*puVar14);
          uVar11 = (this->num_dofs_)._M_elems[this->kNodeOrd];
          if (uVar11 != 0) {
            uVar12 = iVar10 * uVar11;
            plVar7 = (this->dofs_)._M_elems[this->kNodeOrd].
                     super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
                     ._M_start;
            plVar8 = (this->dofs_)._M_elems[this->kCellOrd].
                     super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
                     ._M_start;
            do {
              uVar18 = (ulong)uVar12;
              uVar12 = uVar12 + 1;
              uVar19 = (ulong)uVar22;
              uVar22 = uVar22 + 1;
              plVar8[uVar19] = plVar7[uVar18];
              uVar11 = uVar11 - 1;
            } while (uVar11 != 0);
          }
          puVar14 = puVar14 + 1;
        } while (puVar14 != puVar2);
      }
      iVar10 = (*local_278->_vptr_Entity[2])();
      local_200 = (vector<lf::mesh::Entity_const*,std::allocator<lf::mesh::Entity_const*>> *)
                  CONCAT44(extraout_var_04,iVar10);
      iVar10 = (*local_278->_vptr_Entity[1])(local_278,1);
      local_208 = (vector<lf::mesh::Entity_const*,std::allocator<lf::mesh::Entity_const*>> *)
                  CONCAT44(extraout_var_05,iVar10);
      iVar10 = (*local_278->_vptr_Entity[4])();
      local_1b8[0].type_ = (RefElType)iVar10;
      sVar13 = base::RefEl::NumSubEntities(local_1b8,1);
      if (sVar13 != 0) {
        uVar18 = 0;
        do {
          iVar10 = (*((this->mesh_).
                      super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     _vptr_Mesh[5])();
          uVar11 = this->kEdgeOrd;
          iVar10 = iVar10 * (this->num_dofs_)._M_elems[uVar11];
          if ((this->check_edge_orientation_ == true) && (*(int *)(local_200 + uVar18 * 4) != 1)) {
            if (-1 < (int)local_1d0) {
              plVar7 = (this->dofs_)._M_elems[uVar11].
                       super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_start;
              plVar8 = (this->dofs_)._M_elems[this->kCellOrd].
                       super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_start;
              uVar11 = iVar10 + local_1f4;
              lVar23 = local_1d8;
              do {
                uVar19 = (ulong)uVar22;
                uVar22 = uVar22 + 1;
                plVar8[uVar19] = plVar7[uVar11];
                uVar11 = uVar11 - 1;
                lVar20 = lVar23 + -1;
                bVar9 = 0 < lVar23;
                lVar23 = lVar20;
              } while (lVar20 != 0 && bVar9);
            }
          }
          else if (local_210 != 0) {
            plVar7 = (this->dofs_)._M_elems[uVar11].super__Vector_base<long,_std::allocator<long>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            plVar8 = (this->dofs_)._M_elems[this->kCellOrd].
                     super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
                     ._M_start;
            uVar11 = iVar10 + (int)local_1c0;
            uVar19 = local_210;
            do {
              uVar21 = (ulong)uVar22;
              uVar22 = uVar22 + 1;
              plVar8[uVar21] = plVar7[uVar11];
              uVar11 = uVar11 + 1;
              uVar19 = uVar19 - 1;
            } while (uVar19 != 0);
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 != sVar13);
      }
      iVar10 = (*local_278->_vptr_Entity[4])();
      psVar15 = local_1e8;
      if (((char)iVar10 != '\x03') &&
         (iVar10 = (*local_278->_vptr_Entity[4])(), psVar15 = local_1f0, (char)iVar10 != '\x04')) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,"Illegal cell type; only triangles and quads are supported",0x39);
        paVar3 = &local_250.field_2;
        local_250._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"false","");
        paVar4 = &local_270.field_2;
        local_270._M_dataplus._M_p = (pointer)paVar4;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_270,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/dofhandler.cc"
                   ,"");
        std::__cxx11::stringbuf::str();
        base::AssertionFailed(&local_250,&local_270,0x110,&local_230);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != paVar4) {
          operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != paVar3) {
          operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
        }
        local_250._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"false","");
        local_270._M_dataplus._M_p = (pointer)paVar4;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_270,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/dofhandler.cc"
                   ,"");
        local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"");
        base::AssertionFailed(&local_250,&local_270,0x110,&local_230);
LAB_0014d92d:
        std::__cxx11::string::~string((string *)&local_230);
        std::__cxx11::string::~string((string *)&local_270);
        std::__cxx11::string::~string((string *)&local_250);
        abort();
      }
      uVar18 = local_1e0;
      for (sVar17 = *psVar15; sVar17 != 0; sVar17 = sVar17 - 1) {
        (this->dofs_)._M_elems[this->kCellOrd].super__Vector_base<long,_std::allocator<long>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar22] = lVar25;
        iVar6._M_current =
             (this->dof_entities_).
             super__Vector_base<const_lf::mesh::Entity_*,_std::allocator<const_lf::mesh::Entity_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar6._M_current ==
            (this->dof_entities_).
            super__Vector_base<const_lf::mesh::Entity_*,_std::allocator<const_lf::mesh::Entity_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<lf::mesh::Entity_const*,std::allocator<lf::mesh::Entity_const*>>::
          _M_realloc_insert<lf::mesh::Entity_const*const&>(local_1c8,iVar6,&local_278);
        }
        else {
          *iVar6._M_current = local_278;
          pppEVar1 = &(this->dof_entities_).
                      super__Vector_base<const_lf::mesh::Entity_*,_std::allocator<const_lf::mesh::Entity_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppEVar1 = *pppEVar1 + 1;
        }
        lVar25 = lVar25 + 1;
        uVar22 = uVar22 + 1;
      }
      uVar22 = (int)uVar18 + 1;
      uVar18 = (ulong)uVar22;
    } while (uVar22 != local_1f8);
  }
  this->num_dof_ = (size_type)lVar25;
  return;
}

Assistant:

void UniformFEDofHandler::initIndexArrays() {
  // This method assumes a proper initialization
  // of the data in no_loc_dof_* and num_dofs_, num_dof_tria, num_dofs_quad_
  gdof_idx_t dof_idx = 0;

  // Step I: Set indices for shape functions on nodes
  // Total number of degrees of freedom on nodes (entities of co-dim = 2)
  const size_type no_nodes = mesh_->NumEntities(2);
  const size_type num_dofs_nodes = no_nodes * num_dofs_[kNodeOrd];
  dofs_[kNodeOrd].resize(num_dofs_nodes);
  // Run through nodes in the order given by their numbering
  for (glb_idx_t node_idx = 0; node_idx < no_nodes; node_idx++) {
    const mesh::Entity *node_p{mesh_->EntityByIndex(2, node_idx)};
    LF_ASSERT_MSG(mesh_->Index(*node_p) == node_idx, "Node index mismatch");
    // Beginning of section for concrete node in the dof index vector
    // for entities of co-dimension 2
    glb_idx_t node_dof_offset = node_idx * num_dofs_[kNodeOrd];
    for (unsigned j = 0; j < num_loc_dof_point_; j++) {
      dofs_[kNodeOrd][node_dof_offset++] = dof_idx;
      dof_entities_.push_back(node_p);  // Store entity for current dof
      dof_idx++;                        // Move on to next index
    }
  }

  // Step II: Set indices for shape functions on edges
  // Total number of degrees of freedom belonging to edges (entities of co-dim =
  // 1)
  const size_type no_edges = mesh_->NumEntities(1);
  const size_type num_dofs_edges = no_edges * num_dofs_[kEdgeOrd];
  dofs_[kEdgeOrd].resize(num_dofs_edges);
  // Visit all edges
  // Old implementation, see remarks above
  // for (const lf::mesh::Entity &edge : mesh_->Entities(1)) {
  for (glb_idx_t edge_idx = 0; edge_idx < no_edges; edge_idx++) {
    // Obtain pointer to edge entity
    const mesh::Entity *edge_p{mesh_->EntityByIndex(1, edge_idx)};
    LF_ASSERT_MSG(mesh_->Index(*edge_p) == edge_idx, "Edge index mismatch");
    // Beginning of section for concrete edge in the dof index vector
    // for entities of co-dimension 1
    glb_idx_t edge_dof_offset = edge_idx * num_dofs_[kEdgeOrd];

    // Obtain indices for basis functions sitting at endpoints
    for (const lf::mesh::Entity *endpoint : edge_p->SubEntities(1)) {
      const glb_idx_t ep_idx(mesh_->Index(*endpoint));
      glb_idx_t ep_dof_offset = ep_idx * num_dofs_[kNodeOrd];
      // Copy indices of shape functions from nodes to edge
      for (unsigned j = 0; j < num_dofs_[kNodeOrd]; j++) {
        dofs_[kEdgeOrd][edge_dof_offset++] = dofs_[kNodeOrd][ep_dof_offset++];
      }
    }
    // Set indices for interior edge degrees of freedom
    for (unsigned j = 0; j < num_loc_dof_segment_; j++) {
      dofs_[kEdgeOrd][edge_dof_offset++] = dof_idx;
      dof_entities_.push_back(edge_p);
      dof_idx++;
    }
  }

  // Step III: Set indices for shape functions on cells
  const size_type no_cells = mesh_->NumEntities(0);
  const size_type max_num_dof_cells = no_cells * num_dofs_[kCellOrd];
  dofs_[kCellOrd].resize(max_num_dof_cells);

  // Number of (non-)interior shape functins for edges
  const size_type no_int_dof_edge = num_loc_dof_segment_;
  const size_type num_ext_dof_edge = num_dofs_[kEdgeOrd] - no_int_dof_edge;

  // Visit all cells
  // Old implementation without strong link between cell
  // indices and ordering of global shape functions
  // for (const lf::mesh::Entity &cell : mesh_->Entities(0)) {
  for (glb_idx_t cell_idx = 0; cell_idx < no_cells; cell_idx++) {
    // Obtain pointer to current ell
    const mesh::Entity *cell_p{mesh_->EntityByIndex(0, cell_idx)};
    LF_ASSERT_MSG(cell_idx == mesh_->Index(*cell_p), "cell index mismatch");
    // Offset for cell dof indices in large dof index vector
    glb_idx_t cell_dof_offset = cell_idx * num_dofs_[kCellOrd];

    // Obtain indices for basis functions in vertices
    for (const lf::mesh::Entity *vertex : cell_p->SubEntities(2)) {
      const glb_idx_t vt_idx(mesh_->Index(*vertex));
      glb_idx_t vt_dof_offset = vt_idx * num_dofs_[kNodeOrd];
      // Copy indices of shape functions from nodes to cell
      for (unsigned j = 0; j < num_dofs_[kNodeOrd]; j++) {
        dofs_[kCellOrd][cell_dof_offset++] = dofs_[kNodeOrd][vt_dof_offset++];
      }
    }

    // Collect indices of interior shape functions of edges
    // Internal ordering may depend on the orientation of the edge, if
    // the check_edge_orientation_ flag is set
    const std::span<const lf::mesh::Orientation> edge_orientations =
        cell_p->RelativeOrientations();
    auto edges = cell_p->SubEntities(1);
    // Loop over edges
    const size_type no_edges_cell = cell_p->RefEl().NumSubEntities(1);
    for (int ed_sub_idx = 0; ed_sub_idx < no_edges_cell; ed_sub_idx++) {
      const glb_idx_t edge_idx = mesh_->Index(*edges[ed_sub_idx]);
      const glb_idx_t edge_int_dof_offset =
          edge_idx * num_dofs_[kEdgeOrd] + num_ext_dof_edge;
      // Copy indices of shape functions from edges to cell
      // The order, in which they are copied depends on the relative orientation
      // of the edge w.r.t. the cell, if the edge_orientation_flag is set
      if (!check_edge_orientation_ or
          (edge_orientations[ed_sub_idx] == lf::mesh::Orientation::positive)) {
        // Cell-internal and intrinsic orientation match, do not tinker with
        // the numbering of local shape functions
        for (int j = 0; j < no_int_dof_edge; j++) {
          dofs_[kCellOrd][cell_dof_offset++] =
              dofs_[kEdgeOrd][edge_int_dof_offset + j];
        }
      } else {
        // lf::mesh::Orientation::negative: Mismatch of orientations
        // reverse numbering of cell-internal d.o.f.s
        for (int j = static_cast<int>(no_int_dof_edge - 1); j >= 0; j--) {
          dofs_[kCellOrd][cell_dof_offset++] =
              dofs_[kEdgeOrd][edge_int_dof_offset + j];
        }
      }
    }

    // Set indices for interior cell degrees of freedom depending on the type of
    // cell. Here we add new degrees of freedom
    size_type num_int_dofs_cell;
    if (cell_p->RefEl() == lf::base::RefEl::kTria()) {
      num_int_dofs_cell = num_loc_dof_tria_;
    } else if (cell_p->RefEl() == lf::base::RefEl::kQuad()) {
      num_int_dofs_cell = num_loc_dof_quad_;
    } else {
      LF_ASSERT_MSG(
          false, "Illegal cell type; only triangles and quads are supported");
    }

    // enlist new interior cell-associated dofs
    for (unsigned j = 0; j < num_int_dofs_cell; j++) {
      dofs_[kCellOrd][cell_dof_offset++] = dof_idx;
      dof_entities_.push_back(cell_p);
      dof_idx++;
    }
  }
  // Finally store total number of shape functions on the mesh.
  num_dof_ = dof_idx;
}